

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageFieldGenerator::GenerateMergingCode
          (MessageFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  MessageFieldGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                     "if (other.$has_property_check$) {\n  if ($has_not_property_check$) {\n    $name$_ = new $type_name$();\n  }\n  $property_name$.MergeFrom(other.$property_name$);\n}\n"
                    );
  return;
}

Assistant:

void MessageFieldGenerator::GenerateMergingCode(io::Printer* printer) {
  printer->Print(
    variables_,
    "if (other.$has_property_check$) {\n"
    "  if ($has_not_property_check$) {\n"
    "    $name$_ = new $type_name$();\n"
    "  }\n"
    "  $property_name$.MergeFrom(other.$property_name$);\n"
    "}\n");
}